

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

float4x4 * ConvexDecomposition::Inverse(float4x4 *__return_storage_ptr__,float4x4 *m)

{
  float fVar1;
  int j;
  float *pfVar2;
  int i;
  int r;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float4 fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float src [16];
  
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    r = (int)lVar3;
    pfVar2 = float4x4::operator()(m,r,0);
    src[lVar3] = *pfVar2;
    pfVar2 = float4x4::operator()(m,r,1);
    src[lVar3 + 4] = *pfVar2;
    pfVar2 = float4x4::operator()(m,r,2);
    src[lVar3 + 8] = *pfVar2;
    pfVar2 = float4x4::operator()(m,r,3);
    src[lVar3 + 0xc] = *pfVar2;
  }
  auVar23._8_8_ = 0;
  auVar23._0_4_ = src[0xe];
  auVar23._4_4_ = src[0xf];
  auVar20._8_8_ = 0;
  auVar20._0_4_ = src[0xc];
  auVar20._4_4_ = src[0xd];
  auVar29._8_8_ = 0;
  auVar29._0_4_ = src[0];
  auVar29._4_4_ = src[1];
  auVar28._8_8_ = 0;
  auVar28._0_4_ = src[2];
  auVar28._4_4_ = src[3];
  auVar22._4_4_ = src[5];
  auVar22._0_4_ = src[4];
  auVar22._8_4_ = src[6];
  auVar22._12_4_ = src[7];
  lVar3 = 0;
  auVar4 = vpermt2ps_avx512vl(auVar23,_DAT_00f60a60,auVar20);
  auVar25 = vshufps_avx(src._32_16_,src._32_16_,0xe7);
  auVar13 = vshufps_avx(auVar23,auVar20,5);
  auVar8 = vmovlhps_avx(auVar23,auVar20);
  auVar26 = vshufps_avx(src._32_16_,src._32_16_,0x24);
  auVar17 = vshufps_avx(auVar28,auVar29,0x50);
  auVar18 = vshufps_avx(auVar29,auVar29,1);
  auVar5 = vpermi2ps_avx512vl(_DAT_00f60a60,auVar28,auVar29);
  auVar6 = vmulps_avx512vl(src._32_16_,auVar13);
  auVar8 = vshufps_avx(auVar8,auVar8,0xf8);
  auVar21._0_4_ = auVar8._0_4_ * auVar26._0_4_;
  auVar21._4_4_ = auVar8._4_4_ * auVar26._4_4_;
  auVar21._8_4_ = auVar8._8_4_ * auVar26._8_4_;
  auVar21._12_4_ = auVar8._12_4_ * auVar26._12_4_;
  auVar7 = vmulps_avx512vl(auVar4,auVar25);
  auVar8 = vshufps_avx512vl(auVar6,auVar6,0x8d);
  auVar9 = vmovshdup_avx512vl(auVar6);
  auVar10 = vshufps_avx512vl(auVar6,auVar6,0xff);
  auVar11 = vmulss_avx512f(auVar6,ZEXT416((uint)src[6]));
  auVar12 = vshufpd_avx512vl(auVar6,auVar6,1);
  auVar4._0_4_ = auVar8._0_4_ * auVar17._0_4_;
  auVar4._4_4_ = auVar8._4_4_ * auVar17._4_4_;
  auVar4._8_4_ = auVar8._8_4_ * auVar17._8_4_;
  auVar4._12_4_ = auVar8._12_4_ * auVar17._12_4_;
  auVar8 = vpermt2ps_avx512vl(auVar6,_DAT_00f60a70,auVar7);
  auVar13 = vshufps_avx512vl(auVar7,auVar7,0x4b);
  auVar14 = vmulss_avx512f(auVar7,ZEXT416((uint)src[6]));
  auVar15 = vshufpd_avx512vl(auVar7,auVar7,1);
  auVar4 = vfmadd231ps_fma(auVar4,auVar18,auVar13);
  auVar13 = vshufps_avx512vl(auVar7,auVar6,0xde);
  auVar8 = vinsertps_avx512f(auVar8,auVar21,0x30);
  auVar13 = vinsertps_avx512f(auVar13,auVar21,0xb0);
  auVar30 = ZEXT416((uint)src[6]);
  auVar16 = vmulss_avx512f(auVar9,auVar30);
  auVar14 = vfmadd231ss_avx512f(auVar14,auVar15,ZEXT416((uint)src[5]));
  auVar8 = vmulps_avx512vl(auVar8,auVar17);
  auVar17 = vmulss_avx512f(auVar10,auVar30);
  auVar18 = vfmadd213ps_avx512vl(auVar13,auVar18,auVar8);
  auVar8 = vshufps_avx512vl(auVar7,auVar7,0xff);
  auVar19 = vmulss_avx512f(auVar21,ZEXT416((uint)src[5]));
  auVar17 = vfmadd231ss_avx512f(auVar17,auVar22,auVar15);
  auVar15 = vshufpd_avx512vl(auVar21,auVar21,1);
  auVar24 = ZEXT416((uint)src[5]);
  auVar16 = vfmadd231ss_avx512f(auVar16,auVar8,auVar24);
  auVar13 = vfmadd231ss_fma(auVar11,auVar22,auVar8);
  auVar8 = vmulss_avx512f(auVar10,auVar24);
  auVar10 = vfmadd231ss_avx512f(auVar19,auVar22,auVar15);
  auVar9 = vfmadd231ss_avx512f(auVar8,auVar22,auVar9);
  auVar11 = vfmadd231ss_avx512f(auVar17,auVar21,ZEXT416((uint)src[7]));
  auVar19 = vshufps_avx512vl(auVar23,auVar20,0x50);
  auVar8 = vshufps_avx(auVar20,auVar20,1);
  auVar15 = vfmadd231ss_avx512f(auVar16,auVar15,ZEXT416((uint)src[7]));
  auVar20 = ZEXT416((uint)src[7]);
  auVar16 = vfmadd231ss_avx512f(auVar13,auVar12,auVar20);
  auVar13 = vpermi2ps_avx512vl(ZEXT816(0x200000005),auVar6,auVar7);
  auVar17 = vmulss_avx512f(auVar6,auVar24);
  auVar6 = vmulss_avx512f(auVar12,auVar24);
  auVar17 = vfmadd231ss_avx512f(auVar17,auVar7,auVar22);
  auVar7 = vmovshdup_avx512vl(auVar7);
  auVar6 = vfmadd231ss_avx512f(auVar6,auVar22,auVar7);
  auVar7 = vfmadd231ss_avx512f(auVar14,auVar7,auVar20);
  auVar12 = vshufps_avx512vl(auVar21,auVar21,0xff);
  auVar9 = vfmadd231ss_avx512f(auVar9,auVar12,auVar20);
  auVar6 = vfmadd231ss_avx512f(auVar6,auVar12,auVar30);
  auVar12 = vmovshdup_avx512vl(auVar21);
  auVar10 = vfmadd231ss_avx512f(auVar10,auVar30,auVar12);
  auVar12 = vfmadd231ss_avx512f(auVar17,auVar12,auVar20);
  auVar14 = vshufps_avx512vl(auVar13,auVar21,0x74);
  auVar20 = vshufps_avx512vl(auVar28,auVar28,0x15);
  auVar21 = vshufps_avx512vl(auVar21,auVar21,0xd2);
  auVar17 = vmovlhps_avx512f(auVar28,auVar29);
  auVar13 = vshufps_avx(auVar22,auVar22,0xe7);
  auVar4 = vfmadd231ps_avx512vl(auVar4,auVar20,auVar21);
  auVar18 = vfmadd213ps_avx512vl(auVar14,auVar20,auVar18);
  auVar14 = vshufps_avx512vl(auVar28,auVar29,5);
  auVar17 = vshufps_avx512vl(auVar17,auVar17,0xf8);
  auVar24._0_8_ = CONCAT44(auVar13._4_4_ * auVar5._4_4_,auVar13._0_4_ * auVar5._0_4_);
  auVar24._8_4_ = auVar13._8_4_ * auVar5._8_4_;
  auVar24._12_4_ = auVar13._12_4_ * auVar5._12_4_;
  auVar5 = vshufps_avx512vl(auVar23,auVar23,0x15);
  auVar14 = vmulps_avx512vl(auVar22,auVar14);
  auVar13 = vshufps_avx(auVar22,auVar22,0x24);
  auVar17 = vmulps_avx512vl(auVar13,auVar17);
  auVar13 = vshufps_avx(auVar24,auVar24,0x4b);
  auVar22 = vshufps_avx512vl(auVar14,auVar14,0x8d);
  auVar20 = vpermi2ps_avx512vl(_DAT_00f60a70,auVar14,auVar24);
  auVar21 = vpermi2ps_avx512vl(_DAT_00f60aa0,auVar24,auVar14);
  auVar22 = vmulps_avx512vl(auVar19,auVar22);
  auVar23 = vpermi2ps_avx512vl(_DAT_00f60ab0,auVar24,auVar17);
  auVar13 = vfmadd231ps_fma(auVar22,auVar8,auVar13);
  auVar22 = vshufps_avx512vl(auVar17,auVar17,0xd2);
  auVar22 = vfmadd231ps_avx512vl(auVar13,auVar5,auVar22);
  auVar13 = vinsertps_avx512f(auVar20,auVar17,0x30);
  auVar20 = vshufps_avx512vl(auVar24,auVar14,0xde);
  auVar19 = vmulps_avx512vl(auVar19,auVar13);
  auVar13 = vinsertps_avx512f(auVar20,auVar17,0xb0);
  auVar20 = vshufps_avx512vl(src._32_16_,src._32_16_,0x49);
  auVar8 = vfmadd213ps_avx512vl(auVar13,auVar8,auVar19);
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._0_8_ = auVar24._0_8_;
  auVar19 = vshufps_avx512vl(auVar13,auVar17,0x79);
  auVar5 = vfmadd213ps_avx512vl(auVar19,auVar5,auVar8);
  auVar8 = vshufps_avx512vl(src._32_16_,src._32_16_,0x33);
  auVar19 = vshufps_avx512vl(auVar24,auVar17,0xbd);
  auVar19 = vmulps_avx512vl(auVar8,auVar19);
  auVar24 = vpermi2ps_avx512vl(_DAT_00f60a90,auVar13,auVar17);
  auVar8 = vshufps_avx(src._32_16_,src._32_16_,0x9e);
  auVar13 = vshufps_avx(src._32_16_,src._32_16_,0x78);
  auVar13 = vmulps_avx512vl(auVar13,auVar23);
  auVar19 = vfmadd213ps_avx512vl(auVar8,auVar24,auVar19);
  auVar8 = vinsertps_avx512f(auVar21,auVar17,0x30);
  auVar19 = vfmadd213ps_avx512vl(auVar20,auVar8,auVar19);
  auVar8 = vpermi2ps_avx512vl(_DAT_00f60ac0,auVar17,auVar14);
  auVar8 = vfmadd213ps_avx512vl(auVar8,auVar25,auVar13);
  auVar25 = vsubss_avx512f(auVar16,auVar11);
  auVar8 = vshufps_avx512vl(auVar8,auVar8,0x72);
  auVar13 = vfmadd231ps_avx512vl(auVar8,auVar26,auVar21);
  fVar1 = auVar7._0_4_ - auVar15._0_4_;
  auVar8 = vmovshdup_avx(auVar29);
  (__return_storage_ptr__->x).x = fVar1;
  (__return_storage_ptr__->x).y = auVar25._0_4_;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ * auVar8._0_4_)),auVar29,
                           ZEXT416((uint)fVar1));
  auVar25 = vsubss_avx512f(auVar9,auVar12);
  auVar26 = vsubss_avx512f(auVar10,auVar6);
  (__return_storage_ptr__->x).z = auVar25._0_4_;
  (__return_storage_ptr__->x).w = auVar26._0_4_;
  auVar25 = vfmadd231ss_fma(auVar8,auVar28,auVar25);
  auVar8 = vmovshdup_avx(auVar28);
  auVar25 = vfmadd231ss_fma(auVar25,auVar26,auVar8);
  fVar27 = (float4)vsubps_avx512vl(auVar4,auVar18);
  __return_storage_ptr__->y = fVar27;
  fVar27 = (float4)vsubps_avx(auVar22,auVar5);
  __return_storage_ptr__->z = fVar27;
  auVar8 = vshufps_avx(auVar13,auVar13,0xd2);
  fVar27 = (float4)vsubps_avx512vl(auVar19,auVar8);
  __return_storage_ptr__->w = fVar27;
  for (; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    (&(__return_storage_ptr__->x).x)[lVar3] =
         (1.0 / auVar25._0_4_) * (&(__return_storage_ptr__->x).x)[lVar3];
  }
  return __return_storage_ptr__;
}

Assistant:

float4x4 Inverse(const float4x4 &m)
{
	float4x4 d;
	float *dst = &d.x.x;
	float tmp[12]; /* temp array for pairs */
	float src[16]; /* array of transpose source matrix */
	float det; /* determinant */
	/* transpose matrix */
	for ( int i = 0; i < 4; i++) {
		src[i] = m(i,0) ;
		src[i + 4] = m(i,1);
		src[i + 8] = m(i,2);
		src[i + 12] = m(i,3); 
	}
	/* calculate pairs for first 8 elements (cofactors) */
	tmp[0]  = src[10] * src[15];
	tmp[1]  = src[11] * src[14];
	tmp[2]  = src[9] * src[15];
	tmp[3]  = src[11] * src[13];
	tmp[4]  = src[9] * src[14];
	tmp[5]  = src[10] * src[13];
	tmp[6]  = src[8] * src[15];
	tmp[7]  = src[11] * src[12];
	tmp[8]  = src[8] * src[14];
	tmp[9]  = src[10] * src[12];
	tmp[10] = src[8] * src[13];
	tmp[11] = src[9] * src[12];
	/* calculate first 8 elements (cofactors) */
	dst[0]  = tmp[0]*src[5] + tmp[3]*src[6] + tmp[4]*src[7];
	dst[0] -= tmp[1]*src[5] + tmp[2]*src[6] + tmp[5]*src[7];
	dst[1]  = tmp[1]*src[4] + tmp[6]*src[6] + tmp[9]*src[7];
	dst[1] -= tmp[0]*src[4] + tmp[7]*src[6] + tmp[8]*src[7];
	dst[2]  = tmp[2]*src[4] + tmp[7]*src[5] + tmp[10]*src[7];
	dst[2] -= tmp[3]*src[4] + tmp[6]*src[5] + tmp[11]*src[7];
	dst[3]  = tmp[5]*src[4] + tmp[8]*src[5] + tmp[11]*src[6];
	dst[3] -= tmp[4]*src[4] + tmp[9]*src[5] + tmp[10]*src[6];
	dst[4]  = tmp[1]*src[1] + tmp[2]*src[2] + tmp[5]*src[3];
	dst[4] -= tmp[0]*src[1] + tmp[3]*src[2] + tmp[4]*src[3];
	dst[5]  = tmp[0]*src[0] + tmp[7]*src[2] + tmp[8]*src[3];
	dst[5] -= tmp[1]*src[0] + tmp[6]*src[2] + tmp[9]*src[3];
	dst[6]  = tmp[3]*src[0] + tmp[6]*src[1] + tmp[11]*src[3];
	dst[6] -= tmp[2]*src[0] + tmp[7]*src[1] + tmp[10]*src[3];
	dst[7]  = tmp[4]*src[0] + tmp[9]*src[1] + tmp[10]*src[2];
	dst[7] -= tmp[5]*src[0] + tmp[8]*src[1] + tmp[11]*src[2];
	/* calculate pairs for second 8 elements (cofactors) */
	tmp[0]  = src[2]*src[7];
	tmp[1]  = src[3]*src[6];
	tmp[2]  = src[1]*src[7];
	tmp[3]  = src[3]*src[5];
	tmp[4]  = src[1]*src[6];
	tmp[5]  = src[2]*src[5];
	tmp[6]  = src[0]*src[7];
	tmp[7]  = src[3]*src[4];
	tmp[8]  = src[0]*src[6];
	tmp[9]  = src[2]*src[4];
	tmp[10] = src[0]*src[5];
	tmp[11] = src[1]*src[4];
	/* calculate second 8 elements (cofactors) */
	dst[8]  = tmp[0]*src[13] + tmp[3]*src[14] + tmp[4]*src[15];
	dst[8] -= tmp[1]*src[13] + tmp[2]*src[14] + tmp[5]*src[15];
	dst[9]  = tmp[1]*src[12] + tmp[6]*src[14] + tmp[9]*src[15];
	dst[9] -= tmp[0]*src[12] + tmp[7]*src[14] + tmp[8]*src[15];
	dst[10] = tmp[2]*src[12] + tmp[7]*src[13] + tmp[10]*src[15];
	dst[10]-= tmp[3]*src[12] + tmp[6]*src[13] + tmp[11]*src[15];
	dst[11] = tmp[5]*src[12] + tmp[8]*src[13] + tmp[11]*src[14];
	dst[11]-= tmp[4]*src[12] + tmp[9]*src[13] + tmp[10]*src[14];
	dst[12] = tmp[2]*src[10] + tmp[5]*src[11] + tmp[1]*src[9];
	dst[12]-= tmp[4]*src[11] + tmp[0]*src[9] + tmp[3]*src[10];
	dst[13] = tmp[8]*src[11] + tmp[0]*src[8] + tmp[7]*src[10];
	dst[13]-= tmp[6]*src[10] + tmp[9]*src[11] + tmp[1]*src[8];
	dst[14] = tmp[6]*src[9] + tmp[11]*src[11] + tmp[3]*src[8];
	dst[14]-= tmp[10]*src[11] + tmp[2]*src[8] + tmp[7]*src[9];
	dst[15] = tmp[10]*src[10] + tmp[4]*src[8] + tmp[9]*src[9];
	dst[15]-= tmp[8]*src[9] + tmp[11]*src[10] + tmp[5]*src[8];
	/* calculate determinant */
	det=src[0]*dst[0]+src[1]*dst[1]+src[2]*dst[2]+src[3]*dst[3];
	/* calculate matrix inverse */
	det = 1/det;
	for ( int j = 0; j < 16; j++)
	dst[j] *= det;
	return d;
}